

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  double *pdVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  ostream *poVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Vector<float,_4>_> *pVVar8;
  pointer pcVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  long lVar15;
  IVal *pIVar16;
  undefined8 *puVar17;
  Vector<float,_4> *pVVar18;
  size_t sVar19;
  MessageBuilder *pMVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  TestStatus *pTVar23;
  byte bVar24;
  IVal reference1;
  FuncSet funcs;
  IVal reference0;
  IVal in3;
  Environment env;
  IVal in0;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  inputs;
  void *outputArr [2];
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa48;
  undefined1 auStack_5b0 [7];
  IVal local_5a9;
  undefined1 local_5a8 [16];
  undefined1 local_598 [24];
  double local_580;
  TestLog *local_548;
  pointer local_540;
  undefined1 local_538 [104];
  size_t local_4d0;
  TestStatus *local_4c8;
  string local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4a0;
  long local_470;
  undefined1 local_468 [16];
  IVal local_458;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  FloatFormat local_2e8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_2b8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_288;
  pointer local_228;
  pointer local_220;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar24 = 0;
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar19 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar11 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void>>
            (&local_288,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar5,(Precision)sVar19,(ulong)(iVar11 + 0xdeadbeef),
             in_stack_fffffffffffffa48);
  local_540 = local_288.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  sVar19 = (long)local_288.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_288.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2b8,sVar19);
  local_2e8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2e8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2e8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2e8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2e8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2e8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2e8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2e8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2e8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4a0._M_impl.super__Rb_tree_header._M_header;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4a0._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_548 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_288.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_288.in1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_288.in2.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_200 = local_288.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_228 = local_2b8.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_220 = local_2b8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_548;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4d0 = sVar19;
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_5a8 + 8);
  local_5a8._8_4_ = _S_red;
  local_598._0_8_ = (_Base_ptr)0x0;
  local_580 = 0.0;
  pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_598._8_8_ = p_Var2;
  local_598._16_8_ = p_Var2;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_5a8);
  if ((_Rb_tree_node_base *)local_598._8_8_ != p_Var2) {
    p_Var13 = (_Rb_tree_node_base *)local_598._8_8_;
    do {
      (**(code **)(**(long **)(p_Var13 + 1) + 0x30))(*(long **)(p_Var13 + 1),&local_1a8);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != p_Var2);
  }
  sVar19 = local_4d0;
  if (local_580 != 0.0) {
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_538._0_8_,local_538._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
      operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_5a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,sVar19 & 0xffffffff,&local_218,&local_228,0);
  lVar14 = 8;
  do {
    *(undefined1 *)((long)&local_470 + lVar14) = 0;
    *(undefined8 *)(local_468 + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar14 + 8) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    *(undefined1 *)((long)&local_470 + lVar14) = 0;
    *(undefined8 *)(local_468 + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar14 + 8) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar14 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar14) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar14 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar14) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    auStack_5b0[lVar14] = 0;
    *(undefined8 *)(local_5a8 + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)(local_5a8 + lVar14 + 8) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    auStack_5b0[lVar14] = 0;
    *(undefined8 *)(local_5a8 + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)(local_5a8 + lVar14 + 8) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    *(undefined1 *)((long)&local_540 + lVar14) = 0;
    *(undefined8 *)(local_538 + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)(local_538 + lVar14 + 8) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  lVar14 = 8;
  do {
    *(undefined1 *)((long)&local_540 + lVar14) = 0;
    *(undefined8 *)(local_538 + lVar14) = 0x7ff0000000000000;
    *(undefined8 *)(local_538 + lVar14 + 8) = 0xfff0000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_5a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a0,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4a0,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_538);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4a0,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_5a9);
  if (local_288.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_540) {
LAB_0089b544:
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar23 = local_4c8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ = (IVal *)(local_468 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar23->m_code = QP_TEST_RESULT_PASS;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_468._0_8_,
               (long)&((Interval *)local_468._0_8_)->m_hasNaN +
               CONCAT44(local_468._12_4_,local_468._8_4_));
    if ((IVal *)local_468._0_8_ == (IVal *)(local_468 + 0x10)) goto LAB_0089b729;
    p_Var21 = (_Base_ptr)CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_);
    pIVar16 = (IVal *)local_468._0_8_;
  }
  else {
    local_470 = sVar19 + (sVar19 == 0);
    lVar14 = 0;
    local_540 = (pointer)0x0;
    do {
      lVar15 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar15 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar15) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar15) = 0xfff0000000000000;
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x68);
      lVar15 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar15 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar15) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar15) = 0xfff0000000000000;
        lVar15 = lVar15 + 0x18;
      } while (lVar15 != 0x68);
      local_538._0_8_ =
           *(undefined8 *)
            local_288.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar14].m_data;
      local_538._8_8_ =
           *(undefined8 *)
            (local_288.in0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar14].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_5a8,fmt,(Vector<float,_4> *)local_538);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_5a8);
      pIVar16 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_468;
      for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar24 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_538._0_8_ =
           *(undefined8 *)
            local_288.in1.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar14].m_data;
      local_538._8_8_ =
           *(undefined8 *)
            (local_288.in1.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar14].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_5a8,fmt,(Vector<float,_4> *)local_538);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_5a8);
      pIVar16 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_468;
      for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar24 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_538._0_8_ =
           *(undefined8 *)
            local_288.in2.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar14].m_data;
      local_538._8_8_ =
           *(undefined8 *)
            (local_288.in2.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar14].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_5a8,fmt,(Vector<float,_4> *)local_538);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_5a8);
      pIVar16 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).in2.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar20 = (MessageBuilder *)local_468;
      for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar24 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4a0,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_458.m_data[1]._0_4_ = (this->m_caseCtx).precision;
      local_458.m_data[0].m_hi = (this->m_caseCtx).floatFormat.m_maxValue;
      local_468._0_8_ = *(undefined8 *)fmt;
      local_468._8_4_ = (this->m_caseCtx).floatFormat.m_fractionBits;
      local_468._12_4_ = (this->m_caseCtx).floatFormat.m_hasSubnormal;
      local_458.m_data[0]._0_4_ = (this->m_caseCtx).floatFormat.m_hasInf;
      local_458.m_data[0]._4_4_ = (this->m_caseCtx).floatFormat.m_hasNaN;
      local_458.m_data[0].m_lo._0_1_ = (this->m_caseCtx).floatFormat.m_exactPrecision;
      local_458.m_data[0].m_lo._1_3_ = *(undefined3 *)&(this->m_caseCtx).floatFormat.field_0x19;
      local_458.m_data[0].m_lo._4_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
      local_458.m_data[1].m_hi._0_4_ = 0;
      pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_458.m_data[1].m_lo = (double)&local_4a0;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(MessageBuilder *)local_468);
      pIVar16 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4a0,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,&local_2e8,pIVar16);
      pMVar20 = (MessageBuilder *)local_468;
      pIVar16 = &local_1a8;
      for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(TestLog **)pIVar16->m_data = pMVar20->m_log;
        pMVar20 = (MessageBuilder *)((long)pMVar20 + (ulong)bVar24 * -0x10 + 8);
        pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      bVar10 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1a8,
                          local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar14);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(&local_1f8,bVar10,(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,
                        CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_) + 1);
      }
      if ((!bVar10) &&
         (uVar12 = (int)local_540 + 1, local_540 = (pointer)(ulong)uVar12, (int)uVar12 < 0x65)) {
        local_468._0_8_ = local_548;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_468 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8)," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar8 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pVVar18 = (Vector<float,_4> *)local_598;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = pVVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_538,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar14),pVVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_538._0_8_,local_538._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
        }
        if ((Vector<float,_4> *)local_5a8._0_8_ != (Vector<float,_4> *)local_598) {
          operator_delete((void *)local_5a8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_598._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar8 = (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pVVar18 = (Vector<float,_4> *)local_598;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = pVVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_538,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_288.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar14),pVVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_538._0_8_,local_538._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
        }
        if ((Vector<float,_4> *)local_5a8._0_8_ != (Vector<float,_4> *)local_598) {
          operator_delete((void *)local_5a8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_598._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar8 = (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pVVar18 = (Vector<float,_4> *)local_598;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = pVVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_538,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_288.in2.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar14),pVVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_538._0_8_,local_538._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
        }
        if ((Vector<float,_4> *)local_5a8._0_8_ != (Vector<float,_4> *)local_598) {
          operator_delete((void *)local_5a8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_598._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar8 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pIVar16 = (IVal *)local_598;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = pIVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_538,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar14),(Vector<float,_4> *)pIVar16)
        ;
        poVar4 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_538._0_8_,local_538._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_4c0,(shaderexecutor *)&local_2e8,(FloatFormat *)&local_1a8,pIVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
        }
        if ((IVal *)local_5a8._0_8_ != (IVal *)local_598) {
          operator_delete((void *)local_5a8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_598._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != local_470);
    iVar11 = (int)local_540;
    if (iVar11 < 0x65) {
      if (iVar11 == 0) goto LAB_0089b544;
    }
    else {
      poVar3 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_548;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar11 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar3 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar11);
    pTVar23 = local_4c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var21 = (_Base_ptr)
              (CONCAT44(local_468._12_4_,local_468._8_4_) +
              CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
    p_Var22 = (_Base_ptr)0xf;
    if ((IVal *)local_5a8._0_8_ != (IVal *)local_598) {
      p_Var22 = (_Base_ptr)local_598._0_8_;
    }
    if (p_Var22 < p_Var21) {
      p_Var22 = (_Base_ptr)0xf;
      if ((IVal *)local_468._0_8_ != (IVal *)(local_468 + 0x10)) {
        p_Var22 = (_Base_ptr)CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_);
      }
      if (p_Var22 < p_Var21) goto LAB_0089b535;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_5a8._0_8_);
    }
    else {
LAB_0089b535:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_5a8,local_468._0_8_);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar17 + 2);
    if ((double *)*puVar17 == pdVar1) {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar17 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar17 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar17;
    }
    local_1a8.m_data[0].m_lo = (double)puVar17[1];
    *puVar17 = pdVar1;
    puVar17[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar23->m_code = QP_TEST_RESULT_FAIL;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if ((IVal *)local_468._0_8_ != (IVal *)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,
                      CONCAT44(local_458.m_data[0]._4_4_,local_458.m_data[0]._0_4_) + 1);
    }
    p_Var21 = (_Base_ptr)local_598._0_8_;
    pIVar16 = (IVal *)local_5a8._0_8_;
    if ((IVal *)local_5a8._0_8_ == (IVal *)local_598) goto LAB_0089b729;
  }
  operator_delete(pIVar16,(ulong)((long)&p_Var21->_M_color + 1));
LAB_0089b729:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4a0);
  if (local_2b8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in2.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in2.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in2.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in2.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar23;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}